

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O0

uint8_t absl::lts_20250127::cord_internal::AllocatedSizeToTagUnchecked(size_t size)

{
  undefined1 local_20;
  undefined1 local_18;
  size_t size_local;
  
  if (size < 0x201) {
    local_18 = (char)(size >> 3) + '\x02';
  }
  else {
    if (size < 0x2001) {
      local_20 = (char)(size >> 6) + ':';
    }
    else {
      local_20 = (char)(size >> 0xc) + 0xb8;
    }
    local_18 = local_20;
  }
  return local_18;
}

Assistant:

constexpr uint8_t AllocatedSizeToTagUnchecked(size_t size) {
  return static_cast<uint8_t>(size <= 512 ? kTagBase + size / 8
                              : size <= 8192
                                  ? kTagBase + 512 / 8 + size / 64 - 512 / 64
                                  : kTagBase + 512 / 8 + ((8192 - 512) / 64) +
                                        size / 4096 - 8192 / 4096);
}